

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O0

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  double dVar1;
  double dVar2;
  size_t sVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  double extraout_XMM0_Qa;
  ulong local_38;
  size_t i_column_sweep;
  size_t i_row_sweep;
  size_t i_row;
  Matrix_Dense<double,_0UL,_0UL> *a_matrix_local;
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this_local;
  
  this->factorised = false;
  Matrix_Dense<double,_0UL,_0UL>::operator=(&this->lu_factorised,a_matrix);
  i_row_sweep = 0;
  while( true ) {
    sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row(&this->lu_factorised);
    if (sVar3 <= i_row_sweep) {
      this->factorised = true;
      return true;
    }
    pvVar4 = &std::
              vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ::operator[](&(this->lu_factorised).
                            super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ,i_row_sweep)->super_vector<double,_std::allocator<double>_>;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar4,i_row_sweep);
    std::abs((int)pvVar4);
    i_column_sweep = i_row_sweep;
    if (extraout_XMM0_Qa < this->factorisation_tolerance) break;
    while( true ) {
      i_column_sweep = i_column_sweep + 1;
      sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row(&this->lu_factorised);
      if (sVar3 <= i_column_sweep) break;
      pvVar4 = &std::
                vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ::operator[](&(this->lu_factorised).
                              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ,i_row_sweep)->super_vector<double,_std::allocator<double>_>;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,i_row_sweep);
      dVar1 = *pvVar5;
      pvVar4 = &std::
                vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ::operator[](&(this->lu_factorised).
                              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                             ,i_column_sweep)->super_vector<double,_std::allocator<double>_>;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,i_row_sweep);
      *pvVar5 = *pvVar5 / dVar1;
      local_38 = i_row_sweep;
      while( true ) {
        local_38 = local_38 + 1;
        sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column(&this->lu_factorised);
        if (sVar3 <= local_38) break;
        pvVar4 = &std::
                  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ::operator[](&(this->lu_factorised).
                                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ,i_column_sweep)->super_vector<double,_std::allocator<double>_>;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,i_row_sweep);
        dVar1 = *pvVar5;
        pvVar4 = &std::
                  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ::operator[](&(this->lu_factorised).
                                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ,i_row_sweep)->super_vector<double,_std::allocator<double>_>;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,local_38);
        dVar2 = *pvVar5;
        pvVar4 = &std::
                  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ::operator[](&(this->lu_factorised).
                                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                               ,i_column_sweep)->super_vector<double,_std::allocator<double>_>;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,local_38);
        *pvVar5 = -dVar1 * dVar2 + *pvVar5;
      }
    }
    i_row_sweep = i_row_sweep + 1;
  }
  return false;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}